

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

void av1_tpl_rdmult_setup(AV1_COMP *cpi)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  TplDepFrame *pTVar4;
  long lVar5;
  double *pdVar6;
  int mi_col;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int mi_row;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  double mc_dep_cost;
  double dVar19;
  double dVar20;
  ulong local_70;
  
  pTVar4 = (cpi->ppi->tpl_data).tpl_frame;
  uVar11 = (ulong)((uint)cpi->gf_frame_index * 0x60);
  if (*(char *)((long)pTVar4->ref_map_index + (uVar11 - 0x20)) != '\0') {
    uVar2 = (cpi->common).mi_params.mi_rows;
    bVar1 = (cpi->ppi->tpl_data).tpl_stats_block_mis_log2;
    iVar15 = 1 << (bVar1 & 0x1f);
    if (0 < (int)uVar2) {
      lVar5 = *(long *)((long)pTVar4->ref_map_index + (uVar11 - 0x18));
      iVar3 = *(int *)((long)pTVar4->ref_map_index + uVar11 + 0x20);
      uVar16 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
      iVar10 = uVar16 + 6;
      if (-1 < (int)(uVar16 + 3)) {
        iVar10 = uVar16 + 3;
      }
      uVar14 = iVar10 >> 2;
      uVar12 = 1;
      if (1 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      local_70 = 0;
      do {
        if (0 < (int)uVar16) {
          pdVar6 = cpi->tpl_rdmult_scaling_factors;
          uVar13 = 0;
          do {
            dVar18 = 0.0;
            dVar19 = 0.0;
            uVar9 = local_70 * 4;
            do {
              iVar10 = (int)uVar9;
              uVar9 = uVar13 * 4 & 0xffffffff;
              do {
                iVar7 = (int)uVar9;
                if ((iVar10 < (int)uVar2) && (iVar7 < (int)uVar16)) {
                  lVar17 = (long)((iVar7 >> (bVar1 & 0x1f)) + (iVar10 >> (bVar1 & 0x1f)) * iVar3) *
                           200;
                  dVar20 = (double)(*(long *)(lVar5 + 0x18 + lVar17) << 7);
                  dVar18 = dVar18 + dVar20;
                  dVar19 = dVar19 + (double)(*(long *)(lVar5 + 0x48 + lVar17) * 0x80 +
                                            ((long)*(int *)((long)pTVar4->ref_map_index +
                                                           uVar11 + 0x34) *
                                             *(long *)(lVar5 + 0x40 + lVar17) + 0x100 >> 9)) +
                                    dVar20;
                }
                uVar8 = iVar7 + iVar15;
                uVar9 = (ulong)uVar8;
              } while ((long)(int)uVar8 < (long)(uVar13 * 4 + 4));
              uVar8 = iVar10 + iVar15;
              uVar9 = (ulong)uVar8;
            } while ((long)(int)uVar8 < (long)(local_70 * 4 + 4));
            pdVar6[local_70 * uVar14 + uVar13] = (dVar18 / dVar19) / (cpi->rd).r0 + 1.2;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar12);
        }
        local_70 = local_70 + 1;
      } while (local_70 != (ulong)uVar2 + 3 >> 2);
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const int tpl_idx = cpi->gf_frame_index;

  assert(
      IMPLIES(cpi->ppi->gf_group.size > 0, tpl_idx < cpi->ppi->gf_group.size));

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const TplDepFrame *const tpl_frame = &tpl_data->tpl_frame[tpl_idx];

  if (!tpl_frame->is_valid) return;

  const TplDepStats *const tpl_stats = tpl_frame->tpl_stats_ptr;
  const int tpl_stride = tpl_frame->stride;
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  const int block_size = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const double c = 1.2;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  // Loop through each 'block_size' X 'block_size' block.
  for (int row = 0; row < num_rows; row++) {
    for (int col = 0; col < num_cols; col++) {
      double intra_cost = 0.0, mc_dep_cost = 0.0;
      // Loop through each mi block.
      for (int mi_row = row * num_mi_h; mi_row < (row + 1) * num_mi_h;
           mi_row += step) {
        for (int mi_col = col * num_mi_w; mi_col < (col + 1) * num_mi_w;
             mi_col += step) {
          if (mi_row >= cm->mi_params.mi_rows || mi_col >= mi_cols_sr) continue;
          const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
              mi_row, mi_col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
          int64_t mc_dep_delta =
              RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                     this_stats->mc_dep_dist);
          intra_cost += (double)(this_stats->recrf_dist << RDDIV_BITS);
          mc_dep_cost +=
              (double)(this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
        }
      }
      const double rk = intra_cost / mc_dep_cost;
      const int index = row * num_cols + col;
      cpi->tpl_rdmult_scaling_factors[index] = rk / cpi->rd.r0 + c;
    }
  }
}